

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int nn_sws_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_chunkref *self_00;
  nn_list *self_01;
  int iVar1;
  msg_chunk *it;
  void *pvVar2;
  void *__src;
  size_t sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  byte bVar6;
  undefined8 uVar7;
  size_t sVar8;
  nn_sws *self_02;
  
  self_02 = (nn_sws *)&self[-0x1a].out.type;
  if (self == (nn_pipebase *)0x0) {
    self_02 = (nn_sws *)0x0;
  }
  if (self_02->state == 4) {
    if (self_02->instate == 5) {
      if (self_02->is_final_frame == 0) {
        nn_backtrace_print();
        pcVar5 = "sws->is_final_frame";
        uVar7 = 0x220;
      }
      else {
        bVar6 = self_02->inhdr[0];
        if ((char)bVar6 < '\0') {
          if (0xfd < (byte)((bVar6 & 0xf) - 0xb)) {
            nn_msg_init(msg,self_02->inmsg_current_chunk_len);
            pvVar2 = nn_chunkref_data(&msg->body);
            memcpy(pvVar2,self_02->inmsg_control,self_02->inmsg_current_chunk_len);
LAB_001251d2:
            nn_sws_recv_hdr(self_02);
            nn_chunkref_init(&msg->hdrs,0x18);
            puVar4 = (undefined8 *)nn_chunkref_data(&msg->hdrs);
            puVar4[1] = 0x1fffffffc;
            *puVar4 = 0x18;
            *(byte *)(puVar4 + 2) = bVar6 & 0x7f;
            return 0;
          }
          nn_backtrace_print();
          pcVar5 = "opcode == NN_WS_OPCODE_PING || opcode == NN_WS_OPCODE_PONG";
          uVar7 = 0x228;
        }
        else {
          nn_backtrace_print();
          pcVar5 = "opcode_hdr & NN_SWS_FRAME_BITMASK_FIN";
          uVar7 = 0x221;
        }
      }
    }
    else if (self_02->instate == 4) {
      if (self_02->is_final_frame == 0) {
        nn_backtrace_print();
        pcVar5 = "sws->is_final_frame";
        uVar7 = 0x1f6;
      }
      else {
        bVar6 = self_02->inmsg_hdr;
        if ((char)bVar6 < '\0') {
          if ((byte)((bVar6 & 0xf) - 3) < 0xfe) {
            nn_backtrace_print();
            pcVar5 = "opcode == NN_WS_OPCODE_BINARY || opcode == NN_WS_OPCODE_TEXT";
            uVar7 = 0x1fe;
          }
          else {
            nn_msg_init(msg,self_02->inmsg_total_size);
            self_01 = &self_02->inmsg_array;
            sVar8 = 0;
            while( true ) {
              iVar1 = nn_list_empty(self_01);
              if (iVar1 != 0) break;
              it = (msg_chunk *)nn_list_begin(self_01);
              pvVar2 = nn_chunkref_data(&msg->body);
              self_00 = &it->chunk;
              __src = nn_chunkref_data(self_00);
              sVar3 = nn_chunkref_size(self_00);
              memcpy((void *)((long)pvVar2 + sVar8),__src,sVar3);
              sVar3 = nn_chunkref_size(self_00);
              sVar8 = sVar8 + sVar3;
              nn_msg_chunk_term(it,self_01);
            }
            if (sVar8 == self_02->inmsg_total_size) {
              iVar1 = nn_list_empty(self_01);
              if (iVar1 != 0) {
                self_02->continuing = 0;
                goto LAB_001251d2;
              }
              nn_backtrace_print();
              pcVar5 = "nn_list_empty (&sws->inmsg_array)";
              uVar7 = 0x210;
            }
            else {
              nn_backtrace_print();
              pcVar5 = "pos == sws->inmsg_total_size";
              uVar7 = 0x20f;
            }
          }
        }
        else {
          nn_backtrace_print();
          pcVar5 = "opcode_hdr & NN_SWS_FRAME_BITMASK_FIN";
          uVar7 = 0x1f7;
        }
      }
    }
    else {
      nn_backtrace_print();
      pcVar5 = "0";
      uVar7 = 0x235;
    }
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,uVar7);
  }
  else {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self_02->state,
            "NN_SWS_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0x1ec);
  }
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_sws_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_sws *sws;
    struct nn_list_item *it;
    struct msg_chunk *ch;
    struct nn_cmsghdr *cmsg;
    uint8_t opcode_hdr;
    uint8_t opcode;
    size_t cmsgsz;
    size_t pos;

    sws = nn_cont (self, struct nn_sws, pipebase);

    nn_assert_state (sws, NN_SWS_STATE_ACTIVE);

    switch (sws->instate) {
    case NN_SWS_INSTATE_RECVD_CHUNKED:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inmsg_hdr;

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two opcodes that can be chunked. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_BINARY ||
                   opcode == NN_WS_OPCODE_TEXT);

        nn_msg_init (msg, sws->inmsg_total_size);

        pos = 0;

        /*  Reassemble incoming message scatter array. */
        while (!nn_list_empty (&sws->inmsg_array)) {
            it = nn_list_begin (&sws->inmsg_array);
            ch = nn_cont (it, struct msg_chunk, item);
            memcpy (((uint8_t*) nn_chunkref_data (&msg->body)) + pos,
                nn_chunkref_data (&ch->chunk),
                nn_chunkref_size (&ch->chunk));
            pos += nn_chunkref_size (&ch->chunk);
            nn_msg_chunk_term (ch, &sws->inmsg_array);
        }

        nn_assert (pos == sws->inmsg_total_size);
        nn_assert (nn_list_empty (&sws->inmsg_array));

        /*  No longer collecting scatter array of incoming msg chunks. */
        sws->continuing = 0;

        nn_sws_recv_hdr (sws);

        break;

    case NN_SWS_INSTATE_RECVD_CONTROL:

        /*  Relay opcode to the user in order to interpret payload. */
        opcode_hdr = sws->inhdr [0];

        /*  This library should not deliver fragmented messages to the
            application, so it's expected that this is the final frame. */
        nn_assert (sws->is_final_frame);
        nn_assert (opcode_hdr & NN_SWS_FRAME_BITMASK_FIN);
        opcode_hdr &= ~NN_SWS_FRAME_BITMASK_FIN;

        /*  The library is expected to have failed any connections with other
            opcodes; these are the only two control opcodes delivered. */
        opcode = opcode_hdr & NN_SWS_FRAME_BITMASK_OPCODE;
        nn_assert (opcode == NN_WS_OPCODE_PING ||
                   opcode == NN_WS_OPCODE_PONG);

        nn_msg_init (msg, sws->inmsg_current_chunk_len);

        memcpy (((uint8_t*) nn_chunkref_data (&msg->body)),
            sws->inmsg_control, sws->inmsg_current_chunk_len);

        nn_sws_recv_hdr (sws);

        break;

    default:
        /*  Unexpected state. */
        nn_assert (0);
        break;
    }

    /*  Allocate and populate WebSocket-specific control headers. */
    cmsgsz = NN_CMSG_SPACE (sizeof (opcode_hdr));
    nn_chunkref_init (&msg->hdrs, cmsgsz);
    cmsg = nn_chunkref_data (&msg->hdrs);
    cmsg->cmsg_level = NN_WS;
    cmsg->cmsg_type = NN_WS_MSG_TYPE;
    cmsg->cmsg_len = cmsgsz;
    memcpy (NN_CMSG_DATA (cmsg), &opcode_hdr, sizeof (opcode_hdr));

    return 0;
}